

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int __thiscall ncnn::Deconvolution::load_param(Deconvolution *this,ParamDict *pd)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  Mat local_98;
  Mat local_58;
  
  iVar3 = ParamDict::get(pd,0,0);
  this->num_output = iVar3;
  iVar3 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar3;
  iVar3 = ParamDict::get(pd,0xb,iVar3);
  this->kernel_h = iVar3;
  iVar3 = ParamDict::get(pd,2,1);
  this->dilation_w = iVar3;
  iVar3 = ParamDict::get(pd,0xc,iVar3);
  this->dilation_h = iVar3;
  iVar3 = ParamDict::get(pd,3,1);
  this->stride_w = iVar3;
  iVar3 = ParamDict::get(pd,0xd,iVar3);
  this->stride_h = iVar3;
  iVar3 = ParamDict::get(pd,4,0);
  this->pad_w = iVar3;
  iVar3 = ParamDict::get(pd,0xe,iVar3);
  this->pad_h = iVar3;
  iVar3 = ParamDict::get(pd,5,0);
  this->bias_term = iVar3;
  iVar3 = ParamDict::get(pd,6,0);
  this->weight_data_size = iVar3;
  iVar3 = ParamDict::get(pd,9,0);
  this->activation_type = iVar3;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,10,&local_58);
  if (&this->activation_params != &local_98) {
    piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->activation_params).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = (this->activation_params).data;
        pAVar2 = (this->activation_params).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->activation_params).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->activation_params).elemsize + 4) = 0;
    (this->activation_params).data = (void *)0x0;
    (this->activation_params).refcount = (int *)0x0;
    (this->activation_params).dims = 0;
    (this->activation_params).w = 0;
    (this->activation_params).h = 0;
    (this->activation_params).c = 0;
    (this->activation_params).cstep = 0;
    (this->activation_params).data = local_98.data;
    (this->activation_params).refcount =
         (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    (this->activation_params).elemsize =
         CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    (this->activation_params).packing = local_98.packing;
    (this->activation_params).allocator = local_98.allocator;
    (this->activation_params).dims = local_98.dims;
    (this->activation_params).w = local_98.w;
    (this->activation_params).h = local_98.h;
    (this->activation_params).c = local_98.c;
    (this->activation_params).cstep = local_98.cstep;
  }
  piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
      }
    }
  }
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.packing = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  piVar1 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int Deconvolution::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_w = pd.get(4, 0);
    pad_h = pd.get(14, pad_w);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    return 0;
}